

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall State::State(State *this,int w,int h,int *numbers)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int **ppiVar4;
  int *piVar5;
  int local_28;
  int local_24;
  int j;
  int i;
  int *numbers_local;
  int h_local;
  int w_local;
  State *this_local;
  
  this->width = w;
  this->height = h;
  this->size = w * h;
  this->previous = (State *)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->height;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar4 = (int **)operator_new__(uVar3);
  this->tiles = ppiVar4;
  for (local_24 = 0; local_24 < this->height; local_24 = local_24 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->width;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar3);
    this->tiles[local_24] = piVar5;
    for (local_28 = 0; local_28 < this->width; local_28 = local_28 + 1) {
      this->tiles[local_24][local_28] = numbers[local_24 * this->width + local_28];
      if (this->tiles[local_24][local_28] == 0) {
        (this->blank).height = local_24;
        (this->blank).width = local_28;
      }
    }
  }
  return;
}

Assistant:

State::State(int w, int h, int* numbers) {
    width = w;
    height = h;
    size = w * h;
    previous = nullptr;

    tiles = new int *[height];
    for (int i = 0; i < height; i++) {
        tiles[i] = new int[width];

        for (int j = 0; j < width; j++) {
            tiles[i][j] = numbers[i * width + j];

            if (tiles[i][j] == 0) {
                blank.height = i;
                blank.width = j;
            }
        }
    }
}